

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

void __thiscall HighsSearch::installNode(HighsSearch *this,OpenNode *node)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer pHVar4;
  reference piVar5;
  const_reference pvVar6;
  reference pvVar7;
  shared_ptr<const_StabilizerOrbits> *this_00;
  void **__args_2;
  long in_RSI;
  double *in_RDI;
  HighsInt col;
  HighsInt i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack;
  bool globalSymmetriesValid;
  vector<int,_std::allocator<int>_> *in_stack_000000a0;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_000000a8;
  HighsDomain *in_stack_000000b0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  shared_ptr<const_StabilizerOrbits> *psVar8;
  HighsDomain *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff98;
  vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  vector<int,_std::allocator<int>_> *local_28;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_20;
  byte local_11;
  long local_10;
  
  local_10 = in_RSI;
  HighsDomain::setDomainChangeStack(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  local_11 = 1;
  pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x695c31);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pHVar4->globalOrbits);
  if (bVar3) {
    local_20 = HighsDomain::getDomainChangeStack((HighsDomain *)(in_RDI + 2));
    local_28 = HighsDomain::getBranchingPositions((HighsDomain *)(in_RDI + 2));
    local_30._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff78), bVar3) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_30);
      iVar1 = *piVar5;
      pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_20,(long)iVar1);
      iVar2 = pvVar6->column;
      pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x695ce2);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(pHVar4->symmetries).columnPosition,(long)iVar2);
      if (*pvVar7 != -1) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x695d15);
        bVar3 = HighsDomain::isBinary
                          (in_stack_ffffffffffffff80,
                           (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        if (!bVar3) {
LAB_00695d66:
          local_11 = 0;
          break;
        }
        pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_20,(long)iVar1);
        if (pvVar6->boundtype == kLower) {
          pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                             (local_20,(long)iVar1);
          if ((pvVar6->boundval == 1.0) && (!NAN(pvVar6->boundval))) goto LAB_00695d66;
        }
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
  }
  psVar8 = (shared_ptr<const_StabilizerOrbits> *)(in_RDI + 0x7d);
  this_00 = (shared_ptr<const_StabilizerOrbits> *)(local_10 + 0x48);
  __args_2 = (void **)(local_10 + 0x50);
  if ((local_11 & 1) == 0) {
    std::shared_ptr<const_StabilizerOrbits>::shared_ptr(this_00,psVar8);
  }
  else {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x695dcf)
    ;
    std::shared_ptr<const_StabilizerOrbits>::shared_ptr(this_00,psVar8);
  }
  std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
  emplace_back<double&,double&,decltype(nullptr),std::shared_ptr<StabilizerOrbits_const>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI,__args_2,this_00);
  std::shared_ptr<const_StabilizerOrbits>::~shared_ptr
            ((shared_ptr<const_StabilizerOrbits> *)0x695e1c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x695e2d);
  *(int *)(in_RDI + 0x78) = *(int *)(local_10 + 0x58) + -1;
  return;
}

Assistant:

void HighsSearch::installNode(HighsNodeQueue::OpenNode&& node) {
  localdom.setDomainChangeStack(node.domchgstack, node.branchings);
  bool globalSymmetriesValid = true;
  if (mipsolver.mipdata_->globalOrbits) {
    // if global orbits have been computed we check whether they are still valid
    // in this node
    const auto& domchgstack = localdom.getDomainChangeStack();
    for (HighsInt i : localdom.getBranchingPositions()) {
      HighsInt col = domchgstack[i].column;
      if (mipsolver.mipdata_->symmetries.columnPosition[col] == -1) continue;

      if (!mipsolver.mipdata_->domain.isBinary(col) ||
          (domchgstack[i].boundtype == HighsBoundType::kLower &&
           domchgstack[i].boundval == 1.0)) {
        globalSymmetriesValid = false;
        break;
      }
    }
  }
  nodestack.emplace_back(
      node.lower_bound, node.estimate, nullptr,
      globalSymmetriesValid ? mipsolver.mipdata_->globalOrbits : nullptr);
  subrootsol.clear();
  depthoffset = node.depth - 1;
}